

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stopwatch.h
# Opt level: O2

time_point_type __thiscall concurrency::stopwatch::elapsed(stopwatch *this)

{
  time_point_type tVar1;
  
  tVar1 = now();
  return tVar1 - this->m_start;
}

Assistant:

STOPWATCH_NODISCARD auto elapsed() const -> time_point_type
    {
      const time_point_type stop { now() };

      #if defined(__CYGWIN__)

      const time_point_type
        elapsed_ns
        {
          static_cast<time_point_type>
          (
              static_cast<time_point_type>(static_cast<time_point_type>(stop - m_start) * UINTMAX_C(1000000000))
            / static_cast<time_point_type>(CLOCKS_PER_SEC)
          )
        };

      #else

      const time_point_type
        elapsed_ns
        {
          static_cast<time_point_type>
          (
            stop - m_start
          )
        };

      #endif

      return elapsed_ns;
    }